

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool tinyusdz::ascii::ParseUnregistredValue(string *_typeName,string *str,Value *value,string *err)

{
  value_type_conflict2 vVar1;
  bool bVar2;
  value_type_conflict2 *pvVar3;
  string *args;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vss;
  optional<unsigned_int> typeId;
  string typeName;
  StreamReader sr;
  AsciiParser parser;
  allocator local_5d9;
  _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  local_5d8;
  storage_union local_5c0;
  undefined **local_5b0;
  any *local_5a8;
  string local_5a0;
  optional<unsigned_int> local_580;
  string local_578;
  string local_558 [32];
  string local_538;
  undefined1 local_518 [32];
  undefined1 local_4f8 [1224];
  
  if (value == (Value *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  args = err;
  local_5a8 = &value->v_;
  ::std::__cxx11::string::string((string *)&local_538,(string *)_typeName);
  ::std::__cxx11::string::string((string *)local_4f8,"[]",(allocator *)local_518);
  bVar2 = endsWith(&local_538,(string *)local_4f8);
  ::std::__cxx11::string::_M_dispose();
  if (bVar2) {
    ::std::__cxx11::string::string((string *)local_518,"[]",(allocator *)&local_5a0);
    removeSuffix((string *)local_4f8,&local_538,(string *)local_518);
    ::std::__cxx11::string::operator=((string *)&local_538,(string *)local_4f8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  tinyusdz::value::TryGetTypeId((optional<unsigned_int> *)local_4f8,&local_538);
  local_580.has_value_ = local_4f8[0];
  if (local_4f8[0] == false) {
    if (err != (string *)0x0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_518,"Unsupported type: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_538);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_518,"\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar2 = false;
    goto LAB_002a30c2;
  }
  local_580.contained = (storage_t<unsigned_int>)local_4f8._4_4_;
  local_518._0_8_ = (str->_M_dataplus)._M_p;
  local_518._8_8_ = str->_M_string_length;
  local_518[0x10] = '\0';
  local_518._24_8_ = 0;
  AsciiParser::AsciiParser((AsciiParser *)local_4f8,(StreamReader *)local_518);
  local_5b0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_5c0.dynamic = (void *)0x0;
  pvVar3 = nonstd::optional_lite::optional<unsigned_int>::value(&local_580);
  vVar1 = *pvVar3;
  if (vVar1 == 0x27) {
    if (bVar2) {
      local_5d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_5d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_5d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                        ((AsciiParser *)local_4f8,
                         (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          *)&local_5d8);
      if (bVar2) {
        linb::any::operator=
                  ((any *)&local_5c0,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)&local_5d8);
      }
      else if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  (local_558,"Failed to parse a value of type `{}[]`",&local_5d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  (&local_5a0,(fmt *)local_558,&local_578,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_5a0);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
      ~_Vector_base(&local_5d8);
LAB_002a3025:
      if (bVar2 == false) goto LAB_002a30a1;
    }
    else {
      bVar2 = AsciiParser::ReadBasicType((AsciiParser *)local_4f8,(uint4 *)&local_5d8);
      if (!bVar2) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::string
                    (local_558,"Failed to parse a value of type `{}`",&local_5d9);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
LAB_002a306b:
          fmt::format<std::__cxx11::string>
                    (&local_5a0,(fmt *)local_558,&local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_5a0);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002a3091;
        }
        goto LAB_002a30a1;
      }
      linb::any::operator=((any *)&local_5c0,(array<unsigned_int,_4UL> *)&local_5d8);
    }
LAB_002a302a:
    linb::any::operator=(local_5a8,(any *)&local_5c0);
    bVar2 = true;
  }
  else {
    if (vVar1 == 0x26) {
      if (bVar2) {
        local_5d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_5d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_5d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                          ((AsciiParser *)local_4f8,
                           (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)&local_5d8);
        if (bVar2) {
          linb::any::operator=
                    ((any *)&local_5c0,
                     (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      *)&local_5d8);
        }
        else if (err != (string *)0x0) {
          ::std::__cxx11::string::string
                    (local_558,"Failed to parse a value of type `{}[]`",&local_5d9);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>
                    (&local_5a0,(fmt *)local_558,&local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_5a0);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::
        _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                         *)&local_5d8);
        goto LAB_002a3025;
      }
      bVar2 = AsciiParser::ReadBasicType((AsciiParser *)local_4f8,(uint3 *)&local_5d8);
      if (bVar2) {
        linb::any::operator=((any *)&local_5c0,(array<unsigned_int,_3UL> *)&local_5d8);
        goto LAB_002a302a;
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string(local_558,"Failed to parse a value of type `{}`",&local_5d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
        goto LAB_002a306b;
      }
    }
    else if (vVar1 == 0x25) {
      if (bVar2) {
        local_5d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_5d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_5d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                          ((AsciiParser *)local_4f8,
                           (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            *)&local_5d8);
        if (bVar2) {
          linb::any::operator=
                    ((any *)&local_5c0,
                     (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      *)&local_5d8);
        }
        else if (err != (string *)0x0) {
          ::std::__cxx11::string::string
                    (local_558,"Failed to parse a value of type `{}[]`",&local_5d9);
          tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string>
                    (&local_5a0,(fmt *)local_558,&local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_5a0);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::
        _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ::~_Vector_base((_Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         *)&local_5d8);
        goto LAB_002a3025;
      }
      bVar2 = AsciiParser::ReadBasicType((AsciiParser *)local_4f8,(uint2 *)&local_5d8);
      if (bVar2) {
        linb::any::operator=((any *)&local_5c0,(array<unsigned_int,_2UL> *)&local_5d8);
        goto LAB_002a302a;
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string(local_558,"Failed to parse a value of type `{}`",&local_5d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
        goto LAB_002a306b;
      }
    }
    else if (err != (string *)0x0) {
      ::std::__cxx11::string::string
                (local_558,"Unsupported or unimplemeneted type `{}`",(allocator *)&local_578);
      fmt::format<std::__cxx11::string>
                (&local_5a0,(fmt *)local_558,(string *)&local_538,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_5a0);
LAB_002a3091:
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
LAB_002a30a1:
    bVar2 = false;
  }
  if (local_5b0 != (undefined **)0x0) {
    (*(code *)local_5b0[4])(&local_5c0);
  }
  AsciiParser::~AsciiParser((AsciiParser *)local_4f8);
LAB_002a30c2:
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool ParseUnregistredValue(const std::string &_typeName, const std::string &str,
                           value::Value *value, std::string *err) {
  if (!value) {
    if (err) {
      (*err) += "`value` argument is nullptr.\n";
    }
    return false;
  }

  bool array_qual = false;
  std::string typeName = _typeName;
  if (endsWith(typeName, "[]")) {
    typeName = removeSuffix(typeName, "[]");
    array_qual = true;
  }

  nonstd::optional<uint32_t> typeId = value::TryGetTypeId(typeName);

  if (!typeId) {
    if (err) {
      (*err) += "Unsupported type: " + typeName + "\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

#define PARSE_BASE_TYPE(__ty)                                            \
  case value::TypeTraits<__ty>::type_id(): {                             \
    if (array_qual) {                                                    \
      std::vector<__ty> vss;                                             \
      if (!parser.ParseBasicTypeArray(&vss)) {                           \
        if (err) {                                                       \
          (*err) = fmt::format("Failed to parse a value of type `{}[]`", \
                               value::TypeTraits<__ty>::type_name());    \
        }                                                                \
        return false;                                                    \
      }                                                                  \
      dst = vss;                                                         \
    } else {                                                             \
      __ty val;                                                          \
      if (!parser.ReadBasicType(&val)) {                                 \
        if (err) {                                                       \
          (*err) = fmt::format("Failed to parse a value of type `{}`",   \
                               value::TypeTraits<__ty>::type_name());    \
        }                                                                \
        return false;                                                    \
      }                                                                  \
      dst = val;                                                         \
    }                                                                    \
    break;                                                               \
  }

  value::Value dst;

  switch (typeId.value()) {
    PARSE_BASE_TYPE(value::uint2)
    PARSE_BASE_TYPE(value::uint3)
    PARSE_BASE_TYPE(value::uint4)
    default: {
      if (err) {
        (*err) =
            fmt::format("Unsupported or unimplemeneted type `{}`", typeName);
      }
      return false;
    }
  }

  (*value) = std::move(dst);

  return true;
}